

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O0

PUThread * p_uthread_current(void)

{
  PUThread *local_18;
  PUThreadBase *base_thread;
  
  local_18 = (PUThread *)p_uthread_get_local(pp_uthread_specific_data);
  if (local_18 == (PUThread *)0x0) {
    local_18 = (PUThread *)p_malloc0(0x30);
    if (local_18 == (PUThread *)0x0) {
      printf("** Error: %s **\n","PUThread::p_uthread_current: failed to allocate memory");
      return (PUThread *)0x0;
    }
    (local_18->base).ref_count = 1;
    p_uthread_set_local(pp_uthread_specific_data,local_18);
  }
  return local_18;
}

Assistant:

P_LIB_API PUThread *
p_uthread_current (void)
{
	PUThreadBase *base_thread = p_uthread_get_local (pp_uthread_specific_data);

	if (P_UNLIKELY (base_thread == NULL)) {
		if (P_UNLIKELY ((base_thread = p_malloc0 (sizeof (PUThreadBase))) == NULL)) {
			P_ERROR ("PUThread::p_uthread_current: failed to allocate memory");
			return NULL;
		}

		base_thread->ref_count = 1;

		p_uthread_set_local (pp_uthread_specific_data, base_thread);
	}

	return (PUThread *) base_thread;
}